

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioWriteVerilog.c
# Opt level: O3

char * Io_WriteVerilogGetName(char *pName)

{
  byte bVar1;
  uint uVar2;
  size_t sVar3;
  ulong uVar4;
  
  sVar3 = strlen(pName);
  uVar2 = (uint)sVar3;
  if (uVar2 == 1) {
    if ((*pName & 0xfeU) != 0x30) {
LAB_0034b445:
      uVar4 = 0;
      while ((bVar1 = pName[uVar4], (byte)((bVar1 & 0xdf) + 0xbf) < 0x1a ||
             (bVar1 == 0x5f || (byte)(bVar1 - 0x30) < 10))) {
        uVar4 = uVar4 + 1;
        if ((uVar2 & 0x7fffffff) == uVar4) {
          return pName;
        }
      }
      goto LAB_0034b487;
    }
  }
  else {
    if (0 < (int)uVar2) goto LAB_0034b445;
    uVar4 = 0;
LAB_0034b487:
    if ((uint)uVar4 == uVar2) {
      return pName;
    }
    Io_WriteVerilogGetName::Buffer[0] = '\\';
    if ((int)uVar2 < 1) goto LAB_0034b4b8;
  }
  Io_WriteVerilogGetName::Buffer[0] = '\\';
  uVar4 = 0;
  do {
    Io_WriteVerilogGetName::Buffer[uVar4 + 1] = pName[uVar4];
    uVar4 = uVar4 + 1;
  } while ((uVar2 & 0x7fffffff) != uVar4);
LAB_0034b4b8:
  Io_WriteVerilogGetName::Buffer[(long)((sVar3 << 0x20) + 0x100000000) >> 0x20] = ' ';
  Io_WriteVerilogGetName::Buffer[(long)((sVar3 << 0x20) + 0x200000000) >> 0x20] = '\0';
  return Io_WriteVerilogGetName::Buffer;
}

Assistant:

char * Io_WriteVerilogGetName( char * pName )
{
    static char Buffer[500];
    int Length, i;
    Length = strlen(pName);
    // consider the case of a signal having name "0" or "1"
    if ( !(Length == 1 && (pName[0] == '0' || pName[0] == '1')) )
    {
        for ( i = 0; i < Length; i++ )
            if ( !((pName[i] >= 'a' && pName[i] <= 'z') || 
                 (pName[i] >= 'A' && pName[i] <= 'Z') || 
                 (pName[i] >= '0' && pName[i] <= '9') || pName[i] == '_') )
                 break;
        if ( i == Length )
            return pName;
    }
    // create Verilog style name
    Buffer[0] = '\\';
    for ( i = 0; i < Length; i++ )
        Buffer[i+1] = pName[i];
    Buffer[Length+1] = ' ';
    Buffer[Length+2] = 0;
    return Buffer;
}